

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_cpp.cpp
# Opt level: O1

string * __thiscall
flatbuffers::cpp::CppGenerator::GenFieldOffsetName_abi_cxx11_
          (string *__return_storage_ptr__,CppGenerator *this,FieldDef *field)

{
  _Alloc_hider _Var1;
  int iVar2;
  size_type sVar3;
  string uname;
  string local_40;
  
  Name_abi_cxx11_(&local_40,this,field);
  _Var1._M_p = local_40._M_dataplus._M_p;
  if (local_40._M_string_length != 0) {
    sVar3 = 0;
    do {
      iVar2 = toupper((uint)(byte)_Var1._M_p[sVar3]);
      _Var1._M_p[sVar3] = (char)iVar2;
      sVar3 = sVar3 + 1;
    } while (local_40._M_string_length != sVar3);
  }
  std::operator+(__return_storage_ptr__,"VT_",&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string GenFieldOffsetName(const FieldDef &field) {
    std::string uname = Name(field);
    std::transform(uname.begin(), uname.end(), uname.begin(), CharToUpper);
    return "VT_" + uname;
  }